

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRConstant * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::
allocate<spirv_cross::TypedID<(spirv_cross::Types)1>&>
          (ObjectPool<spirv_cross::SPIRConstant> *this,TypedID<(spirv_cross::Types)1> *p)

{
  Vector<spirv_cross::SPIRConstant_*> *this_00;
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
  _Var2;
  _Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> _Var3;
  ulong count;
  SPIRConstant *this_01;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>)malloc(count * 0x168);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl !=
        (SPIRConstant *)0x0) {
      SmallVector<spirv_cross::SPIRConstant_*,_0UL>::reserve(this_00,count);
      _Var3._M_head_impl =
           (SPIRConstant *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<spirv_cross::SPIRConstant_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size
                           + 1);
        sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar1] =
             _Var3._M_head_impl;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size = sVar1 + 1;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRConstant_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstant_*,_false>._M_head_impl !=
          (SPIRConstant *)0x0) goto LAB_00198626;
    }
    this_01 = (SPIRConstant *)0x0;
  }
  else {
LAB_00198626:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
    this_01 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRConstant_*,_0UL>::resize(this_00,sVar1 - 1);
    }
    SPIRConstant::SPIRConstant(this_01,p->id);
  }
  return this_01;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}